

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O1

Result __thiscall tonk::SessionIncoming::attemptDecode(SessionIncoming *this)

{
  ostringstream *poVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  SiameseResult SVar7;
  RefCounter *pRVar8;
  OutputWorker *pOVar9;
  Result *success;
  SiameseOriginalPacket *in_RSI;
  ulong uVar10;
  bool bVar11;
  undefined1 in_XMM2 [16];
  uint recoveredOriginalCount;
  SiameseOriginalPacket *recoveredOriginals;
  uint64_t stats [11];
  uint local_234;
  ios_base *local_230;
  SiameseOriginalPacket *local_228;
  SessionIncoming *local_220;
  string local_218;
  long local_1e0;
  long local_1d8;
  undefined1 local_1c0 [8];
  undefined1 local_1b8 [128];
  ios_base aiStack_138 [264];
  
  local_230 = aiStack_138;
  do {
    SVar7 = siamese_decoder_is_ready((SiameseDecoder)in_RSI[0x26].Data);
    if (SVar7 == Siamese_Success) {
      local_228 = (SiameseOriginalPacket *)0x0;
      local_234 = 0;
      SVar7 = siamese_decode((SiameseDecoder)in_RSI[0x26].Data,&local_228,&local_234);
      if (local_234 != 0) {
        uVar10 = 0;
        do {
          onSiameseSolved((SessionIncoming *)local_1c0,in_RSI);
          Result::~Result((Result *)local_1c0);
          uVar10 = uVar10 + 1;
        } while (uVar10 < local_234);
      }
      if (SVar7 == Siamese_Success) {
        resumeProcessing(this);
        bVar11 = (this->Deps).ConnectionRef != (RefCounter *)0x0;
        SVar7 = (SiameseResult)bVar11;
        if (!bVar11) {
          Result::~Result((Result *)this);
        }
      }
      else {
        if (SVar7 != Siamese_NeedMoreData) {
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,"siamese_decode failed","");
          pRVar8 = (RefCounter *)operator_new(0x38);
          *(char **)pRVar8 = "SessionIncoming::decoderAddOriginal";
          (pRVar8->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar8->ShutdownJson).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pRVar8->ShutdownJson,local_1b8._0_8_,
                     (undefined1 *)
                     ((long)(_func_int ***)local_1b8._0_8_ +
                     CONCAT44(local_1b8._12_4_,local_1b8._8_4_)));
          (pRVar8->RefCount).super___atomic_base<int>._M_i = 1;
          *(long *)&(pRVar8->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar7;
          (this->Deps).ConnectionRef = pRVar8;
          if ((IIncomingHandler *)local_1b8._0_8_ != (IIncomingHandler *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_);
          }
          puVar2 = in_RSI[2].Data;
          Result::ToJson_abi_cxx11_(&local_218,(Result *)this);
          if (*(int *)(puVar2 + 8) < 5) {
            local_1b8._0_8_ = *(undefined8 *)puVar2;
            local_1b8._8_4_ = Error;
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,*(char **)(puVar2 + 0x38),*(long *)(puVar2 + 0x40));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"siamese_decode failed: ",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
            pOVar9 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
            goto LAB_00149445;
          }
          goto LAB_0014945e;
        }
        siamese_decoder_stats((SiameseDecoder)in_RSI[0x26].Data,(uint64_t *)&local_218,0xb);
        lVar6 = local_1d8;
        lVar5 = local_1e0;
        puVar2 = in_RSI[2].Data;
        if (*(int *)(puVar2 + 8) < 2) {
          local_1b8._0_8_ = *(undefined8 *)puVar2;
          local_1b8._8_4_ = Debug;
          poVar1 = (ostringstream *)(local_1b8 + 0x10);
          local_220 = this;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,*(char **)(puVar2 + 0x38),*(long *)(puVar2 + 0x40));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Recovery failed and needs more data (rare): Failure rate = "
                     ,0x3b);
          auVar3 = vcvtusi2ss_avx512f(in_XMM2,lVar6);
          auVar4 = vcvtusi2ss_avx512f(in_XMM2,lVar5 + lVar6);
          std::ostream::_M_insert<double>
                    ((double)((ulong)(lVar6 != 0) * (long)(double)(auVar3._0_4_ / auVar4._0_4_)));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," solveFailCount=",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," successCount = ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          pOVar9 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_230);
          this = local_220;
        }
        SVar7 = Siamese_NeedMoreData;
      }
    }
    else if (SVar7 != Siamese_NeedMoreData) {
      local_1b8._0_8_ = (IIncomingHandler *)(local_1b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"siamese_decoder_is_ready failed","");
      pRVar8 = (RefCounter *)operator_new(0x38);
      *(char **)pRVar8 = "SessionIncoming::decoderAddOriginal";
      (pRVar8->ShutdownJson)._M_dataplus._M_p = (pointer)&(pRVar8->ShutdownJson).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pRVar8->ShutdownJson,local_1b8._0_8_,
                 (undefined1 *)
                 ((long)(_func_int ***)local_1b8._0_8_ + CONCAT44(local_1b8._12_4_,local_1b8._8_4_))
                );
      (pRVar8->RefCount).super___atomic_base<int>._M_i = 1;
      *(long *)&(pRVar8->ShutdownLock).super___mutex_base._M_mutex = (long)(int)SVar7;
      (this->Deps).ConnectionRef = pRVar8;
      if ((IIncomingHandler *)local_1b8._0_8_ != (IIncomingHandler *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      puVar2 = in_RSI[2].Data;
      Result::ToJson_abi_cxx11_(&local_218,(Result *)this);
      if (*(int *)(puVar2 + 8) < 5) {
        local_1b8._0_8_ = *(undefined8 *)puVar2;
        local_1b8._8_4_ = Error;
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,*(char **)(puVar2 + 0x38),*(long *)(puVar2 + 0x40));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"siamese_decoder_is_ready failed: ",0x21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_218._M_dataplus._M_p,local_218._M_string_length);
        pOVar9 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
LAB_00149445:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
        std::ios_base::~ios_base(local_230);
      }
LAB_0014945e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      SVar7 = Siamese_InvalidInput;
    }
    if (SVar7 != Siamese_Success) {
      if (SVar7 != Siamese_InvalidInput) {
        (this->Deps).ConnectionRef = (RefCounter *)0x0;
      }
      return (Result)(ErrorResult *)this;
    }
  } while( true );
}

Assistant:

Result SessionIncoming::attemptDecode()
{
    // Run decode loop
    for (;;)
    {
        // Check if decoder is ready
        const int readyResult = siamese_decoder_is_ready(FECDecoder);

        if (readyResult == Siamese_NeedMoreData) {
            break;
        }

        if (readyResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decoder_is_ready failed", ErrorType::Siamese, readyResult);
            Deps.Logger->Error("siamese_decoder_is_ready failed: ", result.ToJson());
            return result;
        }

        SiameseOriginalPacket* recoveredOriginals = nullptr;
        unsigned recoveredOriginalCount = 0;

        // Attempt to decode
        const int decodeResult = siamese_decode(FECDecoder, &recoveredOriginals, &recoveredOriginalCount);

        // Handle any Unordered/Unreliable messages as they are decoded
        for (unsigned i = 0; i < recoveredOriginalCount; ++i) {
            onSiameseSolved(recoveredOriginals[i]);
        }

        if (decodeResult == Siamese_NeedMoreData)
        {
            uint64_t stats[SiameseDecoderStats_Count];
            siamese_decoder_stats(FECDecoder, stats, SiameseDecoderStats_Count);

            uint64_t solveFailCount = stats[SiameseDecoderStats_SolveFailCount];
            uint64_t successCount = stats[SiameseDecoderStats_SolveSuccessCount];

            float failRate = 0.f;
            if (solveFailCount > 0) {
                failRate = solveFailCount / (float)(solveFailCount + successCount);
            }
            Deps.Logger->Debug("Recovery failed and needs more data (rare): Failure rate = ", failRate, " solveFailCount=", solveFailCount, " successCount = ", successCount);

            break;
        }

        if (decodeResult != Siamese_Success)
        {
            Result result = Result("SessionIncoming::decoderAddOriginal", "siamese_decode failed", ErrorType::Siamese, decodeResult);
            Deps.Logger->Error("siamese_decode failed: ", result.ToJson());
            return result;
        }

        //Deps.Logger->Debug("SIAMESE RECOVERED: ", recoveredOriginalCount);

        // Resume processing
        Result result = resumeProcessing();
        if (result.IsFail()) {
            return result;
        }
    }

    return Result::Success();
}